

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

bool peparse::parse_resource_table
               (bounded_buffer *sectionData,uint32_t o,uint32_t virtaddr,uint32_t depth,
               resource_dir_entry *dirent,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  vector<peparse::resource,_std::allocator<peparse::resource>_> *this;
  bool bVar1;
  resource_dir_entry *dirent_00;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  string *result;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  _func_ios_base_ptr_ios_base_ptr *f_04;
  _func_ios_base_ptr_ios_base_ptr *f_05;
  _func_ios_base_ptr_ios_base_ptr *f_06;
  _func_ios_base_ptr_ios_base_ptr *f_07;
  _func_ios_base_ptr_ios_base_ptr *f_08;
  _func_ios_base_ptr_ios_base_ptr *f_09;
  _func_ios_base_ptr_ios_base_ptr *f_10;
  _func_ios_base_ptr_ios_base_ptr *f_11;
  uint32_t uVar5;
  ulong uVar6;
  uint32_t offset;
  uint32_t *out;
  resource_dir_table rdt;
  resource_dat_entry rdat;
  undefined1 local_120 [32];
  resource_dir_entry *local_100;
  uint local_f4;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  bounded_buffer *pbStack_78;
  uint32_t local_6c;
  uint32_t local_68;
  uint16_t local_64;
  uint16_t local_62;
  ushort local_60;
  ushort local_5e;
  uint32_t local_5c;
  uint local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  vector<peparse::resource,_std::allocator<peparse::resource>_> *local_48;
  ulong local_40;
  long local_38;
  
  if (sectionData == (bounded_buffer *)0x0) {
    return false;
  }
  local_100 = dirent;
  bVar1 = readDword(sectionData,o,&local_6c);
  if (bVar1) {
    bVar1 = readDword(sectionData,o + 4,&local_68);
    if (!bVar1) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120ed5);
      to_string<unsigned_int>((string *)local_120,0x296,f_00);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x120009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar4 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar4) {
        local_f0._16_8_ = *puVar4;
        local_f0._24_8_ = puVar3[3];
      }
      else {
        local_f0._16_8_ = *puVar4;
        local_f0._0_8_ = (ulong *)*puVar3;
      }
      local_f0._8_8_ = puVar3[1];
      *puVar3 = puVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_0011083b;
    }
    bVar1 = readWord(sectionData,o + 8,&local_64);
    if (!bVar1) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120ed5);
      to_string<unsigned_int>((string *)local_120,0x297,f_01);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x120009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar4 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar4) {
        local_f0._16_8_ = *puVar4;
        local_f0._24_8_ = puVar3[3];
      }
      else {
        local_f0._16_8_ = *puVar4;
        local_f0._0_8_ = (ulong *)*puVar3;
      }
      local_f0._8_8_ = puVar3[1];
      *puVar3 = puVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_0011083b;
    }
    bVar1 = readWord(sectionData,o + 10,&local_62);
    if (!bVar1) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120ed5);
      to_string<unsigned_int>((string *)local_120,0x298,f_02);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x120009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar4 = puVar3 + 2;
      if ((ulong *)*puVar3 == puVar4) {
        local_f0._16_8_ = *puVar4;
        local_f0._24_8_ = puVar3[3];
      }
      else {
        local_f0._16_8_ = *puVar4;
        local_f0._0_8_ = (ulong *)*puVar3;
      }
      local_f0._8_8_ = puVar3[1];
      *puVar3 = puVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_0011083b;
    }
    bVar1 = readWord(sectionData,o + 0xc,&local_60);
    if (bVar1) {
      bVar1 = readWord(sectionData,o + 0xe,&local_5e);
      if (bVar1) {
        if (local_5e == 0 && local_60 == 0) {
          return true;
        }
        offset = o + 0x10;
        local_5c = depth + 1;
        uVar6 = (ulong)(depth != 1) * 0x20;
        local_38 = 0x18;
        if (depth != 0) {
          local_38 = uVar6 + 0x38;
        }
        local_40 = 0x20;
        if (depth != 0) {
          local_40 = uVar6 | 0x40;
        }
        local_f4 = 0;
        local_48 = rsrcs;
        while( true ) {
          dirent_00 = local_100;
          if (local_100 == (resource_dir_entry *)0x0) {
            dirent_00 = (resource_dir_entry *)operator_new(0x78);
            dirent_00->ID = 0;
            dirent_00->RVA = 0;
            dirent_00->type = 0;
            dirent_00->name = 0;
            dirent_00->lang = 0;
            (dirent_00->type_str)._M_dataplus._M_p = (pointer)&(dirent_00->type_str).field_2;
            (dirent_00->type_str)._M_string_length = 0;
            (dirent_00->type_str).field_2._M_local_buf[0] = '\0';
            (dirent_00->name_str)._M_dataplus._M_p = (pointer)&(dirent_00->name_str).field_2;
            (dirent_00->name_str)._M_string_length = 0;
            (dirent_00->name_str).field_2._M_local_buf[0] = '\0';
            (dirent_00->lang_str)._M_dataplus._M_p = (pointer)&(dirent_00->lang_str).field_2;
            (dirent_00->lang_str)._M_string_length = 0;
            (dirent_00->lang_str).field_2._M_local_buf[0] = '\0';
          }
          bVar1 = readDword(sectionData,offset,&dirent_00->ID);
          if (!bVar1) break;
          out = &dirent_00->RVA;
          bVar1 = readDword(sectionData,offset + 4,out);
          if (!bVar1) {
            err = 6;
            std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
            to_string<unsigned_int>((string *)local_120,0x2b4,f_06);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0,":",(string *)local_120);
            std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
            goto LAB_00110bf9;
          }
          if (depth == 0) {
            dirent_00->type = dirent_00->ID;
            if (local_60 <= local_f4) goto LAB_001102d0;
            uVar5 = dirent_00->ID & 0xfffffff;
            result = &dirent_00->type_str;
LAB_001102bc:
            bVar1 = parse_resource_id(sectionData,uVar5,result);
            if (bVar1) goto LAB_001102d0;
joined_r0x00110bb5:
            if (local_100 != (resource_dir_entry *)0x0) {
              return false;
            }
            goto LAB_00110c39;
          }
          if (depth == 2) {
            dirent_00->lang = dirent_00->ID;
            if (local_f4 < local_60) {
              uVar5 = dirent_00->ID & 0xfffffff;
              result = &dirent_00->lang_str;
              goto LAB_001102bc;
            }
          }
          else {
            if (depth != 1) {
              err = 4;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>((string *)local_120,0x2e5,f_11);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,":",(string *)local_120);
              std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
              goto LAB_001108e1;
            }
            dirent_00->name = dirent_00->ID;
            if (local_f4 < local_60) {
              uVar5 = dirent_00->ID & 0xfffffff;
              result = &dirent_00->name_str;
              goto LAB_001102bc;
            }
          }
LAB_001102d0:
          uVar5 = *out;
          if (-1 < (int)uVar5) {
            bVar1 = readDword(sectionData,uVar5,&local_58);
            if (bVar1) {
              bVar1 = readDword(sectionData,*out + 4,&local_54);
              if (bVar1) {
                bVar1 = readDword(sectionData,*out + 8,&local_50);
                if (bVar1) {
                  bVar1 = readDword(sectionData,*out + 0xc,&local_4c);
                  if (bVar1) {
                    local_f0._0_8_ = local_f0 + 0x10;
                    local_f0._8_8_ = 0;
                    local_f0._16_8_ = local_f0._16_8_ & 0xffffffffffffff00;
                    local_d0._M_p = (pointer)&local_c0;
                    local_c8 = 0;
                    local_c0._M_local_buf[0] = '\0';
                    local_b0._M_p = (pointer)&local_a0;
                    local_a8 = 0;
                    local_a0._M_local_buf[0] = '\0';
                    local_80._0_4_ = 0;
                    local_80._4_4_ = 0;
                    pbStack_78 = (bounded_buffer *)0x0;
                    local_90._0_4_ = 0;
                    local_90._4_4_ = 0;
                    uStack_88._0_4_ = 0;
                    uStack_88._4_4_ = 0;
                    std::__cxx11::string::_M_assign((string *)local_f0);
                    std::__cxx11::string::_M_assign((string *)&local_d0);
                    std::__cxx11::string::_M_assign((string *)&local_b0);
                    this = local_48;
                    local_90._0_4_ = dirent_00->type;
                    local_90._4_4_ = dirent_00->name;
                    uStack_88._4_4_ = local_50;
                    uStack_88._0_4_ = dirent_00->lang;
                    if (((local_58 < virtaddr) ||
                        (pbStack_78 = splitBuffer(sectionData,local_58 - virtaddr,
                                                  local_54 + (local_58 - virtaddr)),
                        pbStack_78 == (bounded_buffer *)0x0)) &&
                       (pbStack_78 = splitBuffer(sectionData,0,0),
                       pbStack_78 == (bounded_buffer *)0x0)) {
                      if (local_100 == (resource_dir_entry *)0x0) {
                        resource_dir_entry::~resource_dir_entry(dirent_00);
                        operator_delete(dirent_00,0x78);
                      }
                      resource::~resource((resource *)local_f0);
                      return false;
                    }
                    std::vector<peparse::resource,_std::allocator<peparse::resource>_>::push_back
                              (this,(value_type *)local_f0);
                    resource::~resource((resource *)local_f0);
                    goto LAB_00110496;
                  }
                  err = 6;
                  std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                  to_string<unsigned_int>((string *)local_120,0x324,f_10);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0,":",(string *)local_120);
                  std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
                }
                else {
                  err = 6;
                  std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                  to_string<unsigned_int>((string *)local_120,0x31a,f_09);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0,":",(string *)local_120);
                  std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
                }
              }
              else {
                err = 6;
                std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                to_string<unsigned_int>((string *)local_120,0x310,f_08);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0,":",(string *)local_120);
                std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
              }
            }
            else {
              err = 6;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>((string *)local_120,0x306,f_07);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,":",(string *)local_120);
              std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
            }
            if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
              operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
            }
            if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
            }
            goto joined_r0x00110bb5;
          }
          bVar1 = parse_resource_table
                            (sectionData,uVar5 & 0xfffffff,virtaddr,local_5c,dirent_00,local_48);
          if (!bVar1) goto LAB_00110c26;
LAB_00110496:
          *(undefined8 *)((long)&dirent_00->ID + local_40) = 0;
          **(undefined1 **)((long)&dirent_00->ID + local_38) = 0;
          if (local_100 == (resource_dir_entry *)0x0) {
            resource_dir_entry::~resource_dir_entry(dirent_00);
            operator_delete(dirent_00,0x78);
          }
          local_f4 = local_f4 + 1;
          offset = offset + 8;
          if ((uint)local_5e + (uint)local_60 <= local_f4) {
            return true;
          }
        }
        err = 6;
        std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120ed5);
        to_string<unsigned_int>((string *)local_120,0x2ab,f_05);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x120009);
        local_f0._0_8_ = local_f0 + 0x10;
        puVar4 = puVar3 + 2;
        if ((ulong *)*puVar3 == puVar4) {
          local_f0._16_8_ = *puVar4;
          local_f0._24_8_ = puVar3[3];
        }
        else {
          local_f0._16_8_ = *puVar4;
          local_f0._0_8_ = (ulong *)*puVar3;
        }
        local_f0._8_8_ = puVar3[1];
        *puVar3 = puVar4;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
LAB_00110bf9:
        if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
LAB_00110c26:
        if (local_100 != (resource_dir_entry *)0x0) {
          return false;
        }
LAB_00110c39:
        resource_dir_entry::~resource_dir_entry(dirent_00);
        uVar6 = 0x78;
        local_120._0_8_ = dirent_00;
        goto LAB_00110868;
      }
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>((string *)local_120,0x29a,f_04);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     ":",(string *)local_120);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
    }
    else {
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>((string *)local_120,0x299,f_03);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     ":",(string *)local_120);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
    }
LAB_001108e1:
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) goto LAB_00110845;
  }
  else {
    err = 6;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120ed5);
    to_string<unsigned_int>((string *)local_120,0x295,f);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x120009);
    local_f0._0_8_ = local_f0 + 0x10;
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_f0._16_8_ = *puVar4;
      local_f0._24_8_ = plVar2[3];
    }
    else {
      local_f0._16_8_ = *puVar4;
      local_f0._0_8_ = (ulong *)*plVar2;
    }
    local_f0._8_8_ = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
LAB_0011083b:
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
LAB_00110845:
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  if ((resource_dir_entry *)local_120._0_8_ == (resource_dir_entry *)(local_120 + 0x10)) {
    return false;
  }
  uVar6 = local_120._16_8_ + 1;
LAB_00110868:
  operator_delete((void *)local_120._0_8_,uVar6);
  return false;
}

Assistant:

bool parse_resource_table(bounded_buffer *sectionData,
                          std::uint32_t o,
                          std::uint32_t virtaddr,
                          std::uint32_t depth,
                          resource_dir_entry *dirent,
                          std::vector<resource> &rsrcs) {
  resource_dir_table rdt;

  if (sectionData == nullptr) {
    return false;
  }

  READ_DWORD(sectionData, o, rdt, Characteristics);
  READ_DWORD(sectionData, o, rdt, TimeDateStamp);
  READ_WORD(sectionData, o, rdt, MajorVersion);
  READ_WORD(sectionData, o, rdt, MinorVersion);
  READ_WORD(sectionData, o, rdt, NameEntries);
  READ_WORD(sectionData, o, rdt, IDEntries);

  o += sizeof(resource_dir_table);

  if (rdt.NameEntries == 0u && rdt.IDEntries == 0u) {
    return true; // This is not a hard error. It does happen.
  }

  for (std::uint32_t i = 0;
       i < static_cast<std::uint32_t>(rdt.NameEntries + rdt.IDEntries);
       i++) {
    resource_dir_entry *rde = dirent;
    if (dirent == nullptr) {
      rde = new resource_dir_entry;
    }

    if (!readDword(sectionData, o + offsetof(__typeof__(*rde), ID), rde->ID)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    if (!readDword(
            sectionData, o + offsetof(__typeof__(*rde), RVA), rde->RVA)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    o += sizeof(resource_dir_entry_sz);

    if (depth == 0) {
      rde->type = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->type_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 1) {
      rde->name = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->name_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 2) {
      rde->lang = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->lang_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else {
      /* .rsrc can accommodate up to 2**31 levels, but Windows only uses 3 by
       * convention. As such, any depth above 3 indicates potentially unchecked
       * recursion. See:
       * https://docs.microsoft.com/en-us/windows/desktop/debug/pe-format#the-rsrc-section
       */

      PE_ERR(PEERR_RESC);
      return false;
    }

    // High bit 0 = RVA to RDT.
    // High bit 1 = RVA to RDE.
    if (rde->RVA & 0x80000000) {
      if (!parse_resource_table(sectionData,
                                rde->RVA & 0x0FFFFFFF,
                                virtaddr,
                                depth + 1,
                                rde,
                                rsrcs)) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }
    } else {
      resource_dat_entry rdat;

      /*
       * This one is using rde->RVA as an offset.
       *
       * This is because we don't want to set o because we have to keep the
       * original value when we are done parsing this resource data entry.
       * We could store the original o value and reset it when we are done,
       * but meh.
       */

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), RVA),
                     rdat.RVA)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), size),
                     rdat.size)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), codepage),
                     rdat.codepage)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), reserved),
                     rdat.reserved)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      resource rsrc;
      rsrc.type_str = rde->type_str;
      rsrc.name_str = rde->name_str;
      rsrc.lang_str = rde->lang_str;
      rsrc.type = rde->type;
      rsrc.name = rde->name;
      rsrc.lang = rde->lang;
      rsrc.codepage = rdat.codepage;
      rsrc.RVA = rdat.RVA;
      rsrc.size = rdat.size;

      // The start address is (RVA - section virtual address).
      uint32_t start = rdat.RVA - virtaddr;
      /*
       * Some binaries (particularly packed) will have invalid addresses here.
       * If those happen, return a zero length buffer.
       * If the start is valid, try to get the data and if that fails return
       * a zero length buffer.
       */
      if (start > rdat.RVA) {
        rsrc.buf = splitBuffer(sectionData, 0, 0);
      } else {
        rsrc.buf = splitBuffer(sectionData, start, start + rdat.size);
        if (rsrc.buf == nullptr) {
          rsrc.buf = splitBuffer(sectionData, 0, 0);
        }
      }

      /* If we can't get even a zero length buffer, something is very wrong. */
      if (rsrc.buf == nullptr) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      rsrcs.push_back(rsrc);
    }

    if (depth == 0) {
      rde->type_str.clear();
    } else if (depth == 1) {
      rde->name_str.clear();
    } else if (depth == 2) {
      rde->lang_str.clear();
    }

    if (dirent == nullptr) {
      delete rde;
    }
  }

  return true;
}